

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall TimerNode::TimerNode(TimerNode *this,TimerNode *tn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->expiredTime_ = 0;
  (this->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tn->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (tn->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

TimerNode::TimerNode(TimerNode &tn)
    : SPHttpData(tn.SPHttpData), expiredTime_(0) {}